

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O3

size_t ZSTD_estimateCStreamSize_usingCCtxParams(ZSTD_CCtx_params *params)

{
  size_t sVar1;
  ZSTD_paramSwitch_e useRowMatchFinder;
  ulong uVar2;
  long lVar3;
  ulong uVar4;
  size_t buffInSize;
  size_t buffOutSize;
  ZSTD_compressionParameters cParams;
  
  if (0 < params->nbWorkers) {
    return 0xffffffffffffffff;
  }
  ZSTD_getCParamsFromCCtxParams(&cParams,params,0xffffffffffffffff,0,ZSTD_cpm_noAttachDict);
  sVar1 = params->maxBlockSize;
  uVar2 = 0x20000;
  if (sVar1 != 0) {
    uVar2 = sVar1;
  }
  uVar4 = 1L << ((byte)cParams.windowLog & 0x3f);
  if (uVar4 <= uVar2) {
    uVar2 = uVar4;
  }
  buffInSize = uVar4 + uVar2;
  if (params->inBufferMode != ZSTD_bm_buffered) {
    buffInSize = 0;
  }
  buffOutSize = 0;
  if (params->outBufferMode == ZSTD_bm_buffered) {
    uVar4 = 0;
    if (uVar2 < 0x20000) {
      uVar4 = (ulong)(0x20000U - (int)uVar2 >> 0xb);
    }
    lVar3 = uVar4 + (uVar2 >> 8) + uVar2;
    buffOutSize = 0xffffffffffffffb9;
    if (lVar3 != 0) {
      buffOutSize = lVar3 + 1;
    }
  }
  useRowMatchFinder = params->useRowMatchFinder;
  if ((useRowMatchFinder == ZSTD_ps_auto) &&
     (useRowMatchFinder = ZSTD_ps_disable, 0xfffffffc < (params->cParams).strategy - ZSTD_btlazy2))
  {
    useRowMatchFinder = ((params->cParams).windowLog < 0xf) + ZSTD_ps_enable;
  }
  sVar1 = ZSTD_estimateCCtxSize_usingCCtxParams_internal
                    (&cParams,&params->ldmParams,1,useRowMatchFinder,buffInSize,buffOutSize,
                     0xffffffffffffffff,params->useSequenceProducer,sVar1);
  return sVar1;
}

Assistant:

size_t ZSTD_estimateCStreamSize_usingCCtxParams(const ZSTD_CCtx_params* params)
{
    RETURN_ERROR_IF(params->nbWorkers > 0, GENERIC, "Estimate CCtx size is supported for single-threaded compression only.");
    {   ZSTD_compressionParameters const cParams =
                ZSTD_getCParamsFromCCtxParams(params, ZSTD_CONTENTSIZE_UNKNOWN, 0, ZSTD_cpm_noAttachDict);
        size_t const blockSize = MIN(ZSTD_resolveMaxBlockSize(params->maxBlockSize), (size_t)1 << cParams.windowLog);
        size_t const inBuffSize = (params->inBufferMode == ZSTD_bm_buffered)
                ? ((size_t)1 << cParams.windowLog) + blockSize
                : 0;
        size_t const outBuffSize = (params->outBufferMode == ZSTD_bm_buffered)
                ? ZSTD_compressBound(blockSize) + 1
                : 0;
        ZSTD_paramSwitch_e const useRowMatchFinder = ZSTD_resolveRowMatchFinderMode(params->useRowMatchFinder, &params->cParams);

        return ZSTD_estimateCCtxSize_usingCCtxParams_internal(
            &cParams, &params->ldmParams, 1, useRowMatchFinder, inBuffSize, outBuffSize,
            ZSTD_CONTENTSIZE_UNKNOWN, params->useSequenceProducer, params->maxBlockSize);
    }
}